

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O2

void __thiscall
gss::innards::HomomorphismModel::_build_exact_path_graphs
          (HomomorphismModel *this,
          vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *graph_rows,
          uint size,uint *idx,uint number_of_exact_path_graphs,bool directed,bool at_most,
          bool pattern)

{
  pointer puVar1;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint v;
  int a;
  allocator_type local_17a;
  allocator_type local_179;
  HomomorphismModel *local_178;
  vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *local_170;
  uint *local_168;
  ulong local_160;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  path_counts;
  value_type nv;
  value_type nc;
  
  uVar5 = (ulong)size;
  nc._data.short_data[0]._0_4_ = 0;
  local_178 = this;
  local_170 = graph_rows;
  local_168 = idx;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nv,uVar5,
             (value_type_conflict3 *)&nc,&local_179);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&path_counts,uVar5,(value_type *)&nv,&local_17a);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&nv);
  local_160 = uVar5;
  for (uVar7 = 0; uVar7 != local_160; uVar7 = uVar7 + 1) {
    SVOBitset::SVOBitset
              (&nv,(local_170->
                   super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                   )._M_impl.super__Vector_impl_data._M_start + local_178->max_graphs * (int)uVar7);
    if (at_most) {
      SVOBitset::set(&nv,(int)uVar7);
    }
    while (uVar3 = SVOBitset::find_first(&nv), uVar3 != 0xffffffff) {
      SVOBitset::reset(&nv,uVar3);
      SVOBitset::SVOBitset
                (&nc,(local_170->
                     super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                     )._M_impl.super__Vector_impl_data._M_start + local_178->max_graphs * uVar3);
      if (at_most) {
        SVOBitset::set(&nc,uVar3);
      }
      while( true ) {
        uVar3 = SVOBitset::find_first(&nc);
        if ((uVar3 == 0xffffffff) || (uVar7 < uVar3 && !directed)) break;
        SVOBitset::reset(&nc,uVar3);
        puVar1 = path_counts.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar3;
        *puVar1 = *puVar1 + 1;
      }
      SVOBitset::~SVOBitset(&nc);
    }
    SVOBitset::~SVOBitset(&nv);
  }
  uVar5 = local_160;
  for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
    a = (int)uVar7;
    uVar8 = 0;
    if (!directed) {
      uVar8 = uVar7 & 0xffffffff;
    }
    for (; uVar8 < uVar5; uVar8 = uVar8 + 1) {
      if (uVar7 == uVar8 && at_most) {
        SVOBitset::set((local_170->
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       (local_178->max_graphs * a + *local_168),a);
      }
      else {
        uVar3 = path_counts.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar8].
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        uVar6 = 0;
        while (uVar4 = uVar6, uVar6 = uVar4 + 1, uVar6 <= number_of_exact_path_graphs) {
          if (uVar6 <= uVar3) {
            SVOBitset::set((local_170->
                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                           )._M_impl.super__Vector_impl_data._M_start +
                           (local_178->max_graphs * a + *local_168 + uVar4),(int)uVar8);
            if (!directed) {
              SVOBitset::set((local_170->
                             super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                             )._M_impl.super__Vector_impl_data._M_start +
                             (uVar4 + local_178->max_graphs * (int)uVar8 + *local_168),a);
            }
          }
        }
      }
      uVar5 = local_160;
    }
  }
  if (pattern) {
    for (uVar3 = 1; uVar3 <= number_of_exact_path_graphs; uVar3 = uVar3 + 1) {
      _Var2._M_head_impl =
           (local_178->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      std::__cxx11::to_string((string *)&nc,uVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nv,
                     "exact_path_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nc);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(_Var2._M_head_impl)->supplemental_graph_names,(value_type *)&nv);
      std::__cxx11::string::~string((string *)&nv);
      std::__cxx11::string::~string((string *)&nc);
    }
  }
  *local_168 = *local_168 + number_of_exact_path_graphs;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&path_counts);
  return;
}

Assistant:

auto HomomorphismModel::_build_exact_path_graphs(vector<SVOBitset> & graph_rows, unsigned size, unsigned & idx,
    unsigned number_of_exact_path_graphs, bool directed, bool at_most, bool pattern) -> void
{
    vector<vector<unsigned>> path_counts(size, vector<unsigned>(size, 0));

    // count number of paths from w to v (unless directed, only w >= v, so not v to w)
    for (unsigned v = 0; v < size; ++v) {
        auto nv = graph_rows[v * max_graphs + 0];
        if (at_most)
            nv.set(v);
        for (auto c = nv.find_first(); c != decltype(nv)::npos; c = nv.find_first()) {
            nv.reset(c);
            auto nc = graph_rows[c * max_graphs + 0];
            if (at_most)
                nc.set(c);
            for (auto w = nc.find_first(); w != decltype(nc)::npos && (directed ? true : w <= v); w = nc.find_first()) {
                nc.reset(w);
                ++path_counts[v][w];
            }
        }
    }

    for (unsigned v = 0; v < size; ++v) {
        for (unsigned w = (directed ? 0 : v); w < size; ++w) {
            if (at_most && v == w)
                graph_rows[v * max_graphs + idx].set(w);
            else {
                // unless directed, w to v, not v to w, see above
                unsigned path_count = path_counts[w][v];
                for (unsigned p = 1; p <= number_of_exact_path_graphs; ++p) {
                    if (path_count >= p) {
                        graph_rows[v * max_graphs + idx + p - 1].set(w);
                        if (! directed)
                            graph_rows[w * max_graphs + idx + p - 1].set(v);
                    }
                }
            }
        }
    }

    if (pattern)
        for (unsigned p = 1; p <= number_of_exact_path_graphs; ++p)
            _imp->supplemental_graph_names.push_back("exact_path_" + to_string(p));

    idx += number_of_exact_path_graphs;
}